

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::OutputFile::Data::~Data(Data *this)

{
  LineBuffer *pLVar1;
  long *plVar2;
  Array<char> *pAVar3;
  pointer pOVar4;
  pointer puVar5;
  pointer ppLVar6;
  ulong uVar7;
  
  ppLVar6 = (this->lineBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar6) {
    uVar7 = 0;
    do {
      pLVar1 = ppLVar6[uVar7];
      if (pLVar1 != (LineBuffer *)0x0) {
        plVar2 = (long *)(pLVar1->sampleCountTableBuffer)._size;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 8))();
        }
        IlmThread_3_4::Semaphore::~Semaphore((Semaphore *)&pLVar1->scanLineMin);
        if ((Compressor **)pLVar1->sampleCountTablePtr != &pLVar1->sampleCountTableCompressor) {
          operator_delete(pLVar1->sampleCountTablePtr,
                          (ulong)((long)&pLVar1->sampleCountTableCompressor->_vptr_Compressor + 1));
        }
        pAVar3 = (pLVar1->buffer)._data;
        if (pAVar3 != (Array<char> *)0x0) {
          operator_delete__(pAVar3);
        }
        operator_delete(pLVar1,0x90);
      }
      uVar7 = uVar7 + 1;
      ppLVar6 = (this->lineBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(this->lineBuffers).
                                   super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3))
    ;
  }
  if (ppLVar6 != (pointer)0x0) {
    operator_delete(ppLVar6,(long)(this->lineBuffers).
                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar6
                   );
  }
  pOVar4 = (this->slices).
           super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pOVar4 != (pointer)0x0) {
    operator_delete(pOVar4,(long)(this->slices).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pOVar4);
  }
  puVar5 = (this->offsetInLineBuffer).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar5 = (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->lineOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

OutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        delete lineBuffers[i];
}